

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int export_tls12_params(ptls_buffer_t *output,int is_server,int session_reused,
                       ptls_cipher_suite_t *cipher,void *client_random,char *server_name,
                       ptls_iovec_t negotiated_protocol,void *enc_key,void *enc_iv,uint64_t enc_seq,
                       uint64_t enc_record_iv,void *dec_key,void *dec_iv,uint64_t dec_seq)

{
  uint8_t *puVar1;
  ushort uVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  size_t len;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  bool bVar14;
  
  iVar8 = ptls_buffer_reserve_aligned(output,2,'\0');
  if (iVar8 == 0) {
    puVar3 = output->base;
    sVar12 = output->off;
    (puVar3 + sVar12)[0] = '\0';
    (puVar3 + sVar12)[1] = '\0';
    output->off = output->off + 2;
    iVar8 = 0;
  }
  bVar7 = true;
  bVar14 = bVar7;
  if (iVar8 != 0) goto LAB_00117991;
  sVar12 = output->off;
  iVar8 = ptls_buffer_reserve_aligned(output,1,'\0');
  if (iVar8 == 0) {
    output->base[output->off] = (uint8_t)is_server;
    output->off = output->off + 1;
    iVar8 = 0;
  }
  if (iVar8 != 0) goto LAB_00117991;
  iVar8 = ptls_buffer_reserve_aligned(output,1,'\0');
  if (iVar8 == 0) {
    output->base[output->off] = (uint8_t)session_reused;
    output->off = output->off + 1;
    iVar8 = 0;
  }
  if (iVar8 != 0) goto LAB_00117991;
  iVar8 = ptls_buffer_reserve_aligned(output,2,'\0');
  if (iVar8 == 0) {
    puVar3 = output->base;
    sVar13 = output->off;
    (puVar3 + sVar13)[0] = '\x03';
    (puVar3 + sVar13)[1] = '\x03';
    output->off = output->off + 2;
    iVar8 = 0;
  }
  bVar14 = iVar8 != 0;
  if (bVar14) goto LAB_00117991;
  uVar2 = cipher->id;
  iVar8 = ptls_buffer_reserve_aligned(output,2,'\0');
  if (iVar8 == 0) {
    *(ushort *)(output->base + output->off) = uVar2 << 8 | uVar2 >> 8;
    output->off = output->off + 2;
    iVar8 = 0;
  }
  bVar14 = iVar8 != 0;
  if (bVar14) goto LAB_00117991;
  iVar8 = ptls_buffer_reserve_aligned(output,0x20,'\0');
  if (iVar8 == 0) {
    puVar3 = output->base;
    sVar13 = output->off;
    uVar4 = *client_random;
    uVar5 = *(undefined8 *)((long)client_random + 8);
    uVar6 = *(undefined8 *)((long)client_random + 0x18);
    puVar1 = puVar3 + sVar13 + 0x10;
    *(undefined8 *)puVar1 = *(undefined8 *)((long)client_random + 0x10);
    *(undefined8 *)(puVar1 + 8) = uVar6;
    puVar3 = puVar3 + sVar13;
    *(undefined8 *)puVar3 = uVar4;
    *(undefined8 *)(puVar3 + 8) = uVar5;
    output->off = output->off + 0x20;
    iVar8 = 0;
  }
  bVar14 = bVar7;
  if (iVar8 != 0) goto LAB_00117991;
  iVar8 = ptls_buffer_reserve_aligned(output,2,'\0');
  if (iVar8 == 0) {
    puVar3 = output->base;
    sVar13 = output->off;
    (puVar3 + sVar13)[0] = '\0';
    (puVar3 + sVar13)[1] = '\0';
    output->off = output->off + 2;
    iVar8 = 0;
  }
  bVar14 = true;
  if (iVar8 == 0) {
    sVar13 = output->off;
    if (server_name == (char *)0x0) {
      len = 0;
    }
    else {
      len = strlen(server_name);
    }
    iVar9 = ptls_buffer__do_pushv(output,server_name,len);
    bVar14 = iVar9 != 0;
    iVar8 = iVar9;
    if (iVar9 == 0) {
      uVar10 = output->off - sVar13;
      iVar8 = 0x20c;
      bVar14 = true;
      if (uVar10 < 0x10000) {
        lVar11 = 8;
        do {
          output->base[sVar13 - 2] = (uint8_t)(uVar10 >> ((byte)lVar11 & 0x3f));
          lVar11 = lVar11 + -8;
          sVar13 = sVar13 + 1;
        } while (lVar11 != -8);
        bVar14 = false;
        iVar8 = iVar9;
      }
    }
  }
  if (bVar14) goto LAB_00117991;
  iVar8 = ptls_buffer_reserve_aligned(output,2,'\0');
  if (iVar8 == 0) {
    puVar3 = output->base;
    sVar13 = output->off;
    (puVar3 + sVar13)[0] = '\0';
    (puVar3 + sVar13)[1] = '\0';
    output->off = output->off + 2;
    iVar8 = 0;
  }
  bVar14 = true;
  if (iVar8 == 0) {
    sVar13 = output->off;
    iVar8 = ptls_buffer__do_pushv(output,negotiated_protocol.base,negotiated_protocol.len);
    if (iVar8 != 0) goto LAB_00117aec;
    uVar10 = output->off - sVar13;
    if (0xffff < uVar10) {
      iVar8 = 0x20c;
      goto LAB_00117aec;
    }
    lVar11 = 8;
    do {
      output->base[sVar13 - 2] = (uint8_t)(uVar10 >> ((byte)lVar11 & 0x3f));
      lVar11 = lVar11 + -8;
      sVar13 = sVar13 + 1;
    } while (lVar11 != -8);
    bVar14 = false;
    bVar7 = true;
    iVar8 = 0;
  }
  else {
LAB_00117aec:
    bVar7 = false;
  }
  if (!bVar7) goto LAB_00117991;
  iVar8 = ptls_buffer_reserve_aligned(output,2,'\0');
  if (iVar8 == 0) {
    puVar3 = output->base;
    sVar13 = output->off;
    (puVar3 + sVar13)[0] = '\0';
    (puVar3 + sVar13)[1] = '\0';
    output->off = output->off + 2;
    iVar8 = 0;
  }
  bVar7 = true;
  bVar14 = bVar7;
  if (iVar8 == 0) {
    sVar13 = output->off;
    iVar8 = ptls_buffer__do_pushv(output,enc_key,cipher->aead->key_size);
    if ((iVar8 == 0) &&
       (iVar8 = ptls_buffer__do_pushv(output,enc_iv,(cipher->aead->tls12).fixed_iv_size), iVar8 == 0
       )) {
      iVar8 = ptls_buffer_reserve_aligned(output,8,'\0');
      if (iVar8 == 0) {
        *(uint64_t *)(output->base + output->off) =
             enc_seq >> 0x38 | (enc_seq & 0xff000000000000) >> 0x28 |
             (enc_seq & 0xff0000000000) >> 0x18 | (enc_seq & 0xff00000000) >> 8 |
             (enc_seq & 0xff000000) << 8 | (enc_seq & 0xff0000) << 0x18 | (enc_seq & 0xff00) << 0x28
             | enc_seq << 0x38;
        output->off = output->off + 8;
        iVar8 = 0;
      }
      bVar14 = iVar8 != 0;
      if (iVar8 == 0) {
        if ((cipher->aead->tls12).record_iv_size != 0) {
          iVar8 = ptls_buffer_reserve_aligned(output,8,'\0');
          if (iVar8 == 0) {
            *(uint64_t *)(output->base + output->off) =
                 enc_record_iv >> 0x38 | (enc_record_iv & 0xff000000000000) >> 0x28 |
                 (enc_record_iv & 0xff0000000000) >> 0x18 | (enc_record_iv & 0xff00000000) >> 8 |
                 (enc_record_iv & 0xff000000) << 8 | (enc_record_iv & 0xff0000) << 0x18 |
                 (enc_record_iv & 0xff00) << 0x28 | enc_record_iv << 0x38;
            output->off = output->off + 8;
            iVar8 = 0;
          }
          bVar14 = iVar8 != 0;
          if (bVar14) goto LAB_00117ba7;
        }
        iVar8 = ptls_buffer__do_pushv(output,dec_key,cipher->aead->key_size);
        bVar14 = bVar7;
        if ((iVar8 == 0) &&
           (iVar8 = ptls_buffer__do_pushv(output,dec_iv,(cipher->aead->tls12).fixed_iv_size),
           iVar8 == 0)) {
          iVar9 = ptls_buffer_reserve_aligned(output,8,'\0');
          if (iVar9 == 0) {
            *(uint64_t *)(output->base + output->off) =
                 dec_seq >> 0x38 | (dec_seq & 0xff000000000000) >> 0x28 |
                 (dec_seq & 0xff0000000000) >> 0x18 | (dec_seq & 0xff00000000) >> 8 |
                 (dec_seq & 0xff000000) << 8 | (dec_seq & 0xff0000) << 0x18 |
                 (dec_seq & 0xff00) << 0x28 | dec_seq << 0x38;
            output->off = output->off + 8;
            iVar9 = 0;
          }
          bVar14 = iVar9 != 0;
          iVar8 = iVar9;
          if (iVar9 == 0) {
            uVar10 = output->off - sVar13;
            iVar8 = 0x20c;
            bVar14 = bVar7;
            if (uVar10 < 0x10000) {
              lVar11 = 8;
              bVar14 = false;
              do {
                output->base[sVar13 - 2] = (uint8_t)(uVar10 >> ((byte)lVar11 & 0x3f));
                lVar11 = lVar11 + -8;
                sVar13 = sVar13 + 1;
                iVar8 = iVar9;
              } while (lVar11 != -8);
            }
          }
        }
      }
    }
  }
LAB_00117ba7:
  if (!bVar14) {
    iVar9 = ptls_buffer_reserve_aligned(output,2,'\0');
    if (iVar9 == 0) {
      puVar3 = output->base;
      sVar13 = output->off;
      (puVar3 + sVar13)[0] = '\0';
      (puVar3 + sVar13)[1] = '\0';
      output->off = output->off + 2;
      iVar9 = 0;
    }
    bVar14 = true;
    iVar8 = iVar9;
    if (iVar9 == 0) {
      sVar13 = output->off;
      lVar11 = -2;
      do {
        output->base[lVar11 + sVar13] = '\0';
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0);
      bVar14 = false;
      iVar8 = 0;
    }
    if (iVar9 == 0) {
      uVar10 = output->off - sVar12;
      if (uVar10 < 0x10000) {
        lVar11 = 8;
        bVar14 = false;
        do {
          output->base[sVar12 - 2] = (uint8_t)(uVar10 >> ((byte)lVar11 & 0x3f));
          lVar11 = lVar11 + -8;
          sVar12 = sVar12 + 1;
        } while (lVar11 != -8);
      }
      else {
        iVar8 = 0x20c;
        bVar14 = true;
      }
    }
  }
LAB_00117991:
  if (!bVar14) {
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int export_tls12_params(ptls_buffer_t *output, int is_server, int session_reused, ptls_cipher_suite_t *cipher,
                               const void *client_random, const char *server_name, ptls_iovec_t negotiated_protocol,
                               const void *enc_key, const void *enc_iv, uint64_t enc_seq, uint64_t enc_record_iv,
                               const void *dec_key, const void *dec_iv, uint64_t dec_seq)
{
    int ret;

    export_tls_params(output, is_server, session_reused, PTLS_PROTOCOL_VERSION_TLS12, cipher, client_random, server_name,
                      negotiated_protocol, {
                          ptls_buffer_pushv(output, enc_key, cipher->aead->key_size);
                          ptls_buffer_pushv(output, enc_iv, cipher->aead->tls12.fixed_iv_size);
                          ptls_buffer_push64(output, enc_seq);
                          if (cipher->aead->tls12.record_iv_size != 0)
                              ptls_buffer_push64(output, enc_record_iv);
                          ptls_buffer_pushv(output, dec_key, cipher->aead->key_size);
                          ptls_buffer_pushv(output, dec_iv, cipher->aead->tls12.fixed_iv_size);
                          ptls_buffer_push64(output, dec_seq);
                      });
    ret = 0;

Exit:
    return ret;
}